

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

void StoreFullHuffmanCode
               (VP8LBitWriter *bw,HuffmanTree *huff_tree,HuffmanTreeToken *tokens,
               HuffmanTreeCode *tree)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 *in_RCX;
  long in_RDX;
  int nbitpairs;
  int nbits;
  int ix;
  int i_1;
  int length;
  int write_trimmed_length;
  int trimmed_length;
  int trailing_zero_bits;
  int i;
  uint8_t buf_rle [19];
  uint32_t histogram [19];
  HuffmanTreeCode huffman_code;
  int num_tokens;
  int max_tokens;
  uint16_t code_length_bitdepth_symbols [19];
  uint8_t code_length_bitdepth [19];
  int in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffedc;
  uint32_t uVar5;
  uint in_stack_fffffffffffffee0;
  uint uVar6;
  undefined4 in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar7;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int iVar8;
  int in_stack_ffffffffffffff04;
  int iVar9;
  HuffmanTreeToken *in_stack_ffffffffffffff08;
  HuffmanTreeCode *in_stack_ffffffffffffff10;
  int local_d8 [20];
  HuffmanTreeCode local_88;
  uint32_t local_70;
  undefined4 local_6c;
  uint16_t local_68 [24];
  byte local_38 [24];
  undefined4 *local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  memset(local_38,0,0x13);
  memset(local_68,0,0x26);
  local_6c = *local_20;
  local_88.num_symbols = 0x13;
  local_88.code_lengths = local_38;
  local_88.codes = local_68;
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
              in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  local_70 = VP8LCreateCompressedHuffmanTree
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04);
  memset(local_d8,0,0x4c);
  memset(&stack0xffffffffffffff08,0,0x13);
  for (iVar9 = 0; iVar9 < (int)local_70; iVar9 = iVar9 + 1) {
    bVar1 = *(byte *)(local_18 + (long)iVar9 * 2);
    local_d8[bVar1] = local_d8[bVar1] + 1;
  }
  VP8LCreateHuffmanTree
            ((uint32_t *)CONCAT44(iVar9,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc,
             (uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (HuffmanTree *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (HuffmanTreeCode *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  StoreHuffmanTreeOfHuffmanTreeToBitMask
            ((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (uint8_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  ClearHuffmanTreeIfOnlyOneSymbol(&local_88);
  iVar8 = 0;
  uVar5 = local_70;
  uVar2 = local_70;
  while ((uVar4 = uVar5 - 1, 0 < (int)uVar5 &&
         (((in_stack_fffffffffffffeec = (uint)*(byte *)(local_18 + (long)(int)uVar4 * 2),
           in_stack_fffffffffffffeec == 0 || (in_stack_fffffffffffffeec == 0x11)) ||
          (in_stack_fffffffffffffeec == 0x12))))) {
    uVar2 = uVar2 - 1;
    iVar8 = (uint)local_38[(int)in_stack_fffffffffffffeec] + iVar8;
    uVar5 = uVar4;
    if (in_stack_fffffffffffffeec == 0x11) {
      iVar8 = iVar8 + 3;
    }
    else if (in_stack_fffffffffffffeec == 0x12) {
      iVar8 = iVar8 + 7;
    }
  }
  uVar6 = in_stack_fffffffffffffee0 & 0xffffff;
  if (1 < (int)uVar2) {
    uVar6 = CONCAT13(0xc < iVar8,(int3)in_stack_fffffffffffffee0);
  }
  uVar7 = uVar6 >> 0x18;
  uVar5 = local_70;
  if (uVar7 != 0) {
    uVar5 = uVar2;
  }
  uVar4 = uVar5;
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffee4,uVar6),uVar5,
              in_stack_fffffffffffffed8);
  if (uVar7 != 0) {
    if (uVar2 == 2) {
      VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_fffffffffffffee4,uVar6),uVar5,
                  in_stack_fffffffffffffed8);
    }
    else {
      in_stack_fffffffffffffee8 = BitsLog2Floor(uVar2 - 2);
      iVar3 = in_stack_fffffffffffffee8 / 2 + 1;
      VP8LPutBits((VP8LBitWriter *)CONCAT44(iVar3,uVar6),uVar5,in_stack_fffffffffffffed8);
      VP8LPutBits((VP8LBitWriter *)CONCAT44(iVar3,uVar6),uVar5,in_stack_fffffffffffffed8);
    }
  }
  StoreHuffmanTreeToBitMask
            ((VP8LBitWriter *)CONCAT44(iVar9,iVar8),(HuffmanTreeToken *)CONCAT44(uVar2,uVar7),uVar4,
             (HuffmanTreeCode *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  return;
}

Assistant:

static void StoreFullHuffmanCode(VP8LBitWriter* const bw,
                                 HuffmanTree* const huff_tree,
                                 HuffmanTreeToken* const tokens,
                                 const HuffmanTreeCode* const tree) {
  uint8_t code_length_bitdepth[CODE_LENGTH_CODES] = { 0 };
  uint16_t code_length_bitdepth_symbols[CODE_LENGTH_CODES] = { 0 };
  const int max_tokens = tree->num_symbols;
  int num_tokens;
  HuffmanTreeCode huffman_code;
  huffman_code.num_symbols = CODE_LENGTH_CODES;
  huffman_code.code_lengths = code_length_bitdepth;
  huffman_code.codes = code_length_bitdepth_symbols;

  VP8LPutBits(bw, 0, 1);
  num_tokens = VP8LCreateCompressedHuffmanTree(tree, tokens, max_tokens);
  {
    uint32_t histogram[CODE_LENGTH_CODES] = { 0 };
    uint8_t buf_rle[CODE_LENGTH_CODES] = { 0 };
    int i;
    for (i = 0; i < num_tokens; ++i) {
      ++histogram[tokens[i].code];
    }

    VP8LCreateHuffmanTree(histogram, 7, buf_rle, huff_tree, &huffman_code);
  }

  StoreHuffmanTreeOfHuffmanTreeToBitMask(bw, code_length_bitdepth);
  ClearHuffmanTreeIfOnlyOneSymbol(&huffman_code);
  {
    int trailing_zero_bits = 0;
    int trimmed_length = num_tokens;
    int write_trimmed_length;
    int length;
    int i = num_tokens;
    while (i-- > 0) {
      const int ix = tokens[i].code;
      if (ix == 0 || ix == 17 || ix == 18) {
        --trimmed_length;   // discount trailing zeros
        trailing_zero_bits += code_length_bitdepth[ix];
        if (ix == 17) {
          trailing_zero_bits += 3;
        } else if (ix == 18) {
          trailing_zero_bits += 7;
        }
      } else {
        break;
      }
    }
    write_trimmed_length = (trimmed_length > 1 && trailing_zero_bits > 12);
    length = write_trimmed_length ? trimmed_length : num_tokens;
    VP8LPutBits(bw, write_trimmed_length, 1);
    if (write_trimmed_length) {
      if (trimmed_length == 2) {
        VP8LPutBits(bw, 0, 3 + 2);     // nbitpairs=1, trimmed_length=2
      } else {
        const int nbits = BitsLog2Floor(trimmed_length - 2);
        const int nbitpairs = nbits / 2 + 1;
        assert(trimmed_length > 2);
        assert(nbitpairs - 1 < 8);
        VP8LPutBits(bw, nbitpairs - 1, 3);
        VP8LPutBits(bw, trimmed_length - 2, nbitpairs * 2);
      }
    }
    StoreHuffmanTreeToBitMask(bw, tokens, length, &huffman_code);
  }
}